

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layout.h
# Opt level: O0

void __thiscall Iir::LayoutBase::add(LayoutBase *this,complex_t *pole,complex_t *zero)

{
  complex_t v;
  complex_t v_00;
  bool bVar1;
  PoleZeroPair *in_RDI;
  PoleZeroPair *in_stack_ffffffffffffff78;
  complex_t *in_stack_ffffffffffffff88;
  PoleZeroPair *in_stack_ffffffffffffff90;
  
  if ((*(uint *)(in_RDI->poles).super_complex_pair_t.first._M_value & 1) != 0) {
    throw_invalid_argument((char *)in_stack_ffffffffffffff90);
  }
  v._M_value._8_8_ = in_RDI;
  v._M_value._0_8_ = in_stack_ffffffffffffff78;
  bVar1 = is_nan<std::complex<double>>(v);
  if (bVar1) {
    throw_invalid_argument((char *)in_stack_ffffffffffffff90);
  }
  v_00._M_value._8_8_ = in_RDI;
  v_00._M_value._0_8_ = in_stack_ffffffffffffff78;
  bVar1 = is_nan<std::complex<double>>(v_00);
  if (bVar1) {
    throw_invalid_argument((char *)in_stack_ffffffffffffff90);
  }
  PoleZeroPair::PoleZeroPair
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(complex_t *)in_RDI);
  PoleZeroPair::operator=(in_RDI,in_stack_ffffffffffffff78);
  *(int *)(in_RDI->poles).super_complex_pair_t.first._M_value =
       *(int *)(in_RDI->poles).super_complex_pair_t.first._M_value + 1;
  return;
}

Assistant:

void add (const complex_t& pole, const complex_t& zero)
		{
			if (m_numPoles&1)
				throw_invalid_argument(errCantAdd2ndOrder);
			if (Iir::is_nan(pole))
				throw_invalid_argument(errPoleisNaN);
			if (Iir::is_nan(zero))
				throw_invalid_argument(errZeroisNaN);
			m_pair[m_numPoles/2] = PoleZeroPair (pole, zero);
			++m_numPoles;
		}